

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

uint __thiscall
glcts::GeometryShaderRenderingLinesCase::getAmountOfVerticesPerInstance
          (GeometryShaderRenderingLinesCase *this)

{
  TestError *this_00;
  uint local_14;
  uint result;
  GeometryShaderRenderingLinesCase *this_local;
  
  switch(this->m_drawcall_mode) {
  case 1:
    local_14 = 8;
    break;
  case 2:
    local_14 = 4;
    break;
  case 3:
    local_14 = 5;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xa0d);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case 10:
    local_14 = 0x10;
    break;
  case 0xb:
    local_14 = 7;
  }
  return local_14;
}

Assistant:

unsigned int GeometryShaderRenderingLinesCase::getAmountOfVerticesPerInstance()
{
	unsigned int result = 0;

	switch (m_drawcall_mode)
	{
	case GL_LINE_LOOP:
		result = 4;
		break;
	case GL_LINE_STRIP:
		result = 5;
		break;
	case GL_LINE_STRIP_ADJACENCY_EXT:
		result = 7;
		break;
	case GL_LINES:
		result = 8;
		break;
	case GL_LINES_ADJACENCY_EXT:
		result = 16;
		break;

	default:
	{
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (m_drawcall_mode) */

	return result;
}